

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_flushProduced
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,uint blockToFlush,ZSTD_EndDirective end)

{
  buffer_t *pbVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ZSTDMT_jobDescription *pZVar7;
  unsigned_long_long uVar8;
  ulong uVar9;
  ZSTDMT_jobDescription *pZVar10;
  uint *puVar11;
  ulong __n;
  ulong uVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  buffer_t buf;
  
  if (output->size < output->pos) {
    __assert_fail("output->size >= output->pos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x50ec,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  uVar6 = mtctx->jobIDMask & mtctx->doneJobID;
  pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar6].job_mutex);
  if (blockToFlush == 0) {
    pZVar7 = mtctx->jobs;
  }
  else {
    pZVar7 = mtctx->jobs;
    if (mtctx->doneJobID < mtctx->nextJobID) {
      if (pZVar7[uVar6].cSize < pZVar7[uVar6].dstFlushed) {
        __assert_fail("mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x50f1,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (pZVar7[uVar6].dstFlushed == pZVar7[uVar6].cSize) {
        do {
          pZVar10 = pZVar7 + uVar6;
          if (pZVar10->consumed == (pZVar10->src).size) break;
          pthread_cond_wait((pthread_cond_t *)&pZVar10->job_cond,
                            (pthread_mutex_t *)&pZVar10->job_mutex);
          pZVar7 = mtctx->jobs;
        } while (pZVar7[uVar6].dstFlushed == pZVar7[uVar6].cSize);
      }
    }
  }
  pZVar7 = pZVar7 + uVar6;
  uVar2 = pZVar7->consumed;
  uVar12 = pZVar7->cSize;
  uVar3 = (pZVar7->src).size;
  pthread_mutex_unlock((pthread_mutex_t *)&pZVar7->job_mutex);
  if (0xffffffffffffff88 < uVar12) {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
    return uVar12;
  }
  if (uVar3 < uVar2) {
    __assert_fail("srcConsumed <= srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x510a,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  pZVar7 = mtctx->jobs;
  if ((uVar2 == uVar3) && (pZVar7[uVar6].frameChecksumNeeded != 0)) {
    puVar11 = &pZVar7[uVar6].frameChecksumNeeded;
    uVar8 = ZSTD_XXH64_digest(&(mtctx->serial).xxhState);
    sVar13 = *(size_t *)(puVar11 + -0x5a);
    *(int *)((long)((buffer_t *)(puVar11 + -0x3a))->start + sVar13) = (int)uVar8;
    uVar12 = uVar12 + 4;
    *(size_t *)(puVar11 + -0x5a) = sVar13 + 4;
    *puVar11 = 0;
  }
  else if (uVar12 == 0) {
    uVar12 = 0;
    goto LAB_0015d7ac;
  }
  uVar9 = pZVar7[uVar6].dstFlushed;
  sVar13 = output->pos;
  __n = output->size - sVar13;
  if (uVar12 - uVar9 < __n) {
    __n = uVar12 - uVar9;
  }
  if (mtctx->nextJobID <= mtctx->doneJobID) {
    __assert_fail("mtctx->doneJobID < mtctx->nextJobID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5119,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  if (uVar12 < uVar9) {
    __assert_fail("cSize >= mtctx->jobs[wJobID].dstFlushed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x511a,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  pvVar4 = pZVar7[uVar6].dstBuff.start;
  if (pvVar4 == (void *)0x0) {
    __assert_fail("mtctx->jobs[wJobID].dstBuff.start != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x511b,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  if (__n != 0) {
    memcpy((void *)(sVar13 + (long)output->dst),(void *)((long)pvVar4 + uVar9),__n);
    sVar13 = output->pos;
    pZVar7 = mtctx->jobs;
    uVar9 = pZVar7[uVar6].dstFlushed;
  }
  output->pos = sVar13 + __n;
  pZVar7[uVar6].dstFlushed = uVar9 + __n;
  if ((uVar2 == uVar3) && (uVar9 + __n == uVar12)) {
    buf.capacity = pZVar7[uVar6].dstBuff.capacity;
    buf.start = pZVar7[uVar6].dstBuff.start;
    ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
    pbVar1 = &mtctx->jobs[uVar6].dstBuff;
    pbVar1->start = (void *)0x0;
    pbVar1->capacity = 0;
    pZVar7 = mtctx->jobs;
    pZVar7[uVar6].cSize = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar12;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar2;
    auVar14 = vpunpcklqdq_avx(auVar15,auVar14);
    auVar5._0_8_ = mtctx->consumed;
    auVar5._8_8_ = mtctx->produced;
    auVar5 = vpaddq_avx(auVar14,auVar5);
    mtctx->consumed = auVar5._0_8_;
    mtctx->produced = auVar5._8_8_;
    mtctx->doneJobID = mtctx->doneJobID + 1;
  }
LAB_0015d7ac:
  sVar13 = uVar12 - pZVar7[uVar6].dstFlushed;
  if ((((uVar12 < pZVar7[uVar6].dstFlushed || sVar13 == 0) && (sVar13 = 1, uVar3 <= uVar2)) &&
      (mtctx->nextJobID <= mtctx->doneJobID)) &&
     ((mtctx->jobReady == 0 && ((mtctx->inBuff).filled == 0)))) {
    mtctx->allJobsCompleted = mtctx->frameEnded;
    if (end == ZSTD_e_end) {
      sVar13 = (size_t)(mtctx->frameEnded == 0);
    }
    else {
      sVar13 = 0;
    }
  }
  return sVar13;
}

Assistant:

static size_t ZSTDMT_flushProduced(ZSTDMT_CCtx* mtctx, ZSTD_outBuffer* output, unsigned blockToFlush, ZSTD_EndDirective end)
{
    unsigned const wJobID = mtctx->doneJobID & mtctx->jobIDMask;
    DEBUGLOG(5, "ZSTDMT_flushProduced (blocking:%u , job %u <= %u)",
                blockToFlush, mtctx->doneJobID, mtctx->nextJobID);
    assert(output->size >= output->pos);

    ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[wJobID].job_mutex);
    if (  blockToFlush
      && (mtctx->doneJobID < mtctx->nextJobID) ) {
        assert(mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize);
        while (mtctx->jobs[wJobID].dstFlushed == mtctx->jobs[wJobID].cSize) {  /* nothing to flush */
            if (mtctx->jobs[wJobID].consumed == mtctx->jobs[wJobID].src.size) {
                DEBUGLOG(5, "job %u is completely consumed (%u == %u) => don't wait for cond, there will be none",
                            mtctx->doneJobID, (U32)mtctx->jobs[wJobID].consumed, (U32)mtctx->jobs[wJobID].src.size);
                break;
            }
            DEBUGLOG(5, "waiting for something to flush from job %u (currently flushed: %u bytes)",
                        mtctx->doneJobID, (U32)mtctx->jobs[wJobID].dstFlushed);
            ZSTD_pthread_cond_wait(&mtctx->jobs[wJobID].job_cond, &mtctx->jobs[wJobID].job_mutex);  /* block when nothing to flush but some to come */
    }   }

    /* try to flush something */
    {   size_t cSize = mtctx->jobs[wJobID].cSize;                  /* shared */
        size_t const srcConsumed = mtctx->jobs[wJobID].consumed;   /* shared */
        size_t const srcSize = mtctx->jobs[wJobID].src.size;       /* read-only, could be done after mutex lock, but no-declaration-after-statement */
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        if (ZSTD_isError(cSize)) {
            DEBUGLOG(5, "ZSTDMT_flushProduced: job %u : compression error detected : %s",
                        mtctx->doneJobID, ZSTD_getErrorName(cSize));
            ZSTDMT_waitForAllJobsCompleted(mtctx);
            ZSTDMT_releaseAllJobResources(mtctx);
            return cSize;
        }
        /* add frame checksum if necessary (can only happen once) */
        assert(srcConsumed <= srcSize);
        if ( (srcConsumed == srcSize)   /* job completed -> worker no longer active */
          && mtctx->jobs[wJobID].frameChecksumNeeded ) {
            U32 const checksum = (U32)XXH64_digest(&mtctx->serial.xxhState);
            DEBUGLOG(4, "ZSTDMT_flushProduced: writing checksum : %08X \n", checksum);
            MEM_writeLE32((char*)mtctx->jobs[wJobID].dstBuff.start + mtctx->jobs[wJobID].cSize, checksum);
            cSize += 4;
            mtctx->jobs[wJobID].cSize += 4;  /* can write this shared value, as worker is no longer active */
            mtctx->jobs[wJobID].frameChecksumNeeded = 0;
        }

        if (cSize > 0) {   /* compression is ongoing or completed */
            size_t const toFlush = MIN(cSize - mtctx->jobs[wJobID].dstFlushed, output->size - output->pos);
            DEBUGLOG(5, "ZSTDMT_flushProduced: Flushing %u bytes from job %u (completion:%u/%u, generated:%u)",
                        (U32)toFlush, mtctx->doneJobID, (U32)srcConsumed, (U32)srcSize, (U32)cSize);
            assert(mtctx->doneJobID < mtctx->nextJobID);
            assert(cSize >= mtctx->jobs[wJobID].dstFlushed);
            assert(mtctx->jobs[wJobID].dstBuff.start != NULL);
            if (toFlush > 0) {
                memcpy((char*)output->dst + output->pos,
                    (const char*)mtctx->jobs[wJobID].dstBuff.start + mtctx->jobs[wJobID].dstFlushed,
                    toFlush);
            }
            output->pos += toFlush;
            mtctx->jobs[wJobID].dstFlushed += toFlush;  /* can write : this value is only used by mtctx */

            if ( (srcConsumed == srcSize)    /* job is completed */
              && (mtctx->jobs[wJobID].dstFlushed == cSize) ) {   /* output buffer fully flushed => free this job position */
                DEBUGLOG(5, "Job %u completed (%u bytes), moving to next one",
                        mtctx->doneJobID, (U32)mtctx->jobs[wJobID].dstFlushed);
                ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[wJobID].dstBuff);
                DEBUGLOG(5, "dstBuffer released");
                mtctx->jobs[wJobID].dstBuff = g_nullBuffer;
                mtctx->jobs[wJobID].cSize = 0;   /* ensure this job slot is considered "not started" in future check */
                mtctx->consumed += srcSize;
                mtctx->produced += cSize;
                mtctx->doneJobID++;
        }   }

        /* return value : how many bytes left in buffer ; fake it to 1 when unknown but >0 */
        if (cSize > mtctx->jobs[wJobID].dstFlushed) return (cSize - mtctx->jobs[wJobID].dstFlushed);
        if (srcSize > srcConsumed) return 1;   /* current job not completely compressed */
    }
    if (mtctx->doneJobID < mtctx->nextJobID) return 1;   /* some more jobs ongoing */
    if (mtctx->jobReady) return 1;      /* one job is ready to push, just not yet in the list */
    if (mtctx->inBuff.filled > 0) return 1;   /* input is not empty, and still needs to be converted into a job */
    mtctx->allJobsCompleted = mtctx->frameEnded;   /* all jobs are entirely flushed => if this one is last one, frame is completed */
    if (end == ZSTD_e_end) return !mtctx->frameEnded;  /* for ZSTD_e_end, question becomes : is frame completed ? instead of : are internal buffers fully flushed ? */
    return 0;   /* internal buffers fully flushed */
}